

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTranslate.cpp
# Opt level: O3

void TranslateArray(ExpressionTranslateContext *ctx,ExprArray *expression)

{
  ulong uVar1;
  ExprBase *expression_00;
  
  TranslateTypeName(ctx,(expression->super_ExprBase).type);
  Print(ctx,"()");
  expression_00 = (expression->values).head;
  if (expression_00 != (ExprBase *)0x0) {
    uVar1 = 0;
    do {
      Print(ctx,".set(%d, ",uVar1);
      Translate(ctx,expression_00);
      Print(ctx,")");
      uVar1 = (ulong)((int)uVar1 + 1);
      expression_00 = expression_00->next;
    } while (expression_00 != (ExprBase *)0x0);
  }
  return;
}

Assistant:

void TranslateArray(ExpressionTranslateContext &ctx, ExprArray *expression)
{
	TranslateTypeName(ctx, expression->type);
	Print(ctx, "()");

	unsigned index = 0;

	for(ExprBase *curr = expression->values.head; curr; curr = curr->next)
	{
		Print(ctx, ".set(%d, ", index);
		Translate(ctx, curr);
		Print(ctx, ")");

		index++;
	}
}